

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_has_side(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_BOOL *has_side)

{
  REF_INT local_40;
  REF_INT local_3c;
  int local_38;
  int local_34;
  REF_INT local_30;
  REF_INT cell_edge;
  REF_INT cell;
  REF_INT item;
  REF_BOOL *has_side_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_CELL ref_cell_local;
  
  *has_side = 0;
  if ((node0 < 0) || (ref_cell->ref_adj->nnode <= node0)) {
    local_38 = -1;
  }
  else {
    local_38 = ref_cell->ref_adj->first[node0];
  }
  cell_edge = local_38;
  if (local_38 == -1) {
    local_3c = -1;
  }
  else {
    local_3c = ref_cell->ref_adj->item[local_38].ref;
  }
  local_30 = local_3c;
  do {
    if (cell_edge == -1) {
      return 0;
    }
    for (local_34 = 0; local_34 < ref_cell->edge_per; local_34 = local_34 + 1) {
      if (((node0 == ref_cell->c2n[ref_cell->e2n[local_34 << 1] + ref_cell->size_per * local_30]) &&
          (node1 == ref_cell->c2n[ref_cell->e2n[local_34 * 2 + 1] + ref_cell->size_per * local_30]))
         || ((node0 == ref_cell->c2n
                       [ref_cell->e2n[local_34 * 2 + 1] + ref_cell->size_per * local_30] &&
             (node1 == ref_cell->c2n[ref_cell->e2n[local_34 << 1] + ref_cell->size_per * local_30]))
            )) {
        *has_side = 1;
        return 0;
      }
    }
    cell_edge = ref_cell->ref_adj->item[cell_edge].next;
    if (cell_edge == -1) {
      local_40 = -1;
    }
    else {
      local_40 = ref_cell->ref_adj->item[cell_edge].ref;
    }
    local_30 = local_40;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_has_side(REF_CELL ref_cell, REF_INT node0,
                                     REF_INT node1, REF_BOOL *has_side) {
  REF_INT item, cell;
  REF_INT cell_edge;

  *has_side = REF_FALSE;

  each_ref_adj_node_item_with_ref(ref_cell_adj(ref_cell), node0, item, cell)
      each_ref_cell_cell_edge(
          ref_cell,
          cell_edge) if ((node0 == ref_cell_e2n(ref_cell, 0, cell_edge, cell) &&
                          node1 ==
                              ref_cell_e2n(ref_cell, 1, cell_edge, cell)) ||
                         (node0 == ref_cell_e2n(ref_cell, 1, cell_edge, cell) &&
                          node1 ==
                              ref_cell_e2n(ref_cell, 0, cell_edge, cell))) {
    *has_side = REF_TRUE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}